

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

String __thiscall testing::internal::CapturedStream::ReadEntireFile(CapturedStream *this,FILE *file)

{
  pointer pcVar1;
  void *__src;
  size_t sVar2;
  void *__dest;
  size_t extraout_RDX;
  pointer __n;
  String SVar3;
  
  __n = (pointer)0x0;
  fseek((FILE *)file,0,2);
  pcVar1 = (pointer)ftell((FILE *)file);
  __src = operator_new__((ulong)pcVar1);
  fseek((FILE *)file,0,0);
  do {
    sVar2 = fread((pointer)((long)__src + (long)__n),1,(long)pcVar1 - (long)__n,(FILE *)file);
    __n = __n + sVar2;
    if (sVar2 == 0) break;
  } while (__n < pcVar1);
  __dest = operator_new__((ulong)(__n + 1));
  memcpy(__dest,__src,(size_t)__n);
  *(char *)((long)__dest + (long)__n) = '\0';
  *(void **)this = __dest;
  (this->filename_)._M_dataplus._M_p = __n;
  operator_delete__(__src);
  SVar3.length_ = extraout_RDX;
  SVar3.c_str_ = (char *)this;
  return SVar3;
}

Assistant:

String CapturedStream::ReadEntireFile(FILE* file) {
  const size_t file_size = GetFileSize(file);
  char* const buffer = new char[file_size];

  size_t bytes_last_read = 0;  // # of bytes read in the last fread()
  size_t bytes_read = 0;       // # of bytes read so far

  fseek(file, 0, SEEK_SET);

  // Keeps reading the file until we cannot read further or the
  // pre-determined file size is reached.
  do {
    bytes_last_read = fread(buffer+bytes_read, 1, file_size-bytes_read, file);
    bytes_read += bytes_last_read;
  } while (bytes_last_read > 0 && bytes_read < file_size);

  const String content(buffer, bytes_read);
  delete[] buffer;

  return content;
}